

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_benchmark.c
# Opt level: O2

int unset_test(bitset_container_t *B)

{
  uint64_t *puVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  puVar1 = B->words;
  iVar3 = B->cardinality;
  for (uVar4 = 0; (uint)uVar4 < 0x10000; uVar4 = (ulong)((uint)uVar4 + 3)) {
    uVar2 = puVar1[uVar4 >> 6];
    iVar3 = iVar3 - (uint)((uVar2 >> (uVar4 & 0x3f) & 1) != 0);
    puVar1[uVar4 >> 6] = uVar2 & ~(1L << (uVar4 & 0x3f));
  }
  B->cardinality = iVar3;
  return 0;
}

Assistant:

int unset_test(bitset_container_t* B) {
    int x;
    for (x = 0; x < 1 << 16; x += 3) {
        bitset_container_remove(B, (uint16_t)x);
    }
    return 0;
}